

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

char * make_METAL_destarg_assign(Context *ctx,char *buf,size_t buflen,char *fmt,...)

{
  char cVar1;
  char in_AL;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  ulong in_R8;
  undefined8 in_R9;
  char *pcVar8;
  char *pcVar9;
  char *__s;
  char *pcVar10;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char writemask_str [6];
  char regnum_str [16];
  char clampbuf [32];
  va_list ap;
  undefined1 local_1e8 [32];
  ulong local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  char operation [256];
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Da;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  uVar3 = (ctx->dest_arg).writemask;
  if (uVar3 != 0) {
    clampbuf[0x10] = '\0';
    clampbuf[0x11] = '\0';
    clampbuf[0x12] = '\0';
    clampbuf[0x13] = '\0';
    clampbuf[0x14] = '\0';
    clampbuf[0x15] = '\0';
    clampbuf[0x16] = '\0';
    clampbuf[0x17] = '\0';
    clampbuf[0x18] = '\0';
    clampbuf[0x19] = '\0';
    clampbuf[0x1a] = '\0';
    clampbuf[0x1b] = '\0';
    clampbuf[0x1c] = '\0';
    clampbuf[0x1d] = '\0';
    clampbuf[0x1e] = '\0';
    clampbuf[0x1f] = '\0';
    clampbuf[0] = '\0';
    clampbuf[1] = '\0';
    clampbuf[2] = '\0';
    clampbuf[3] = '\0';
    clampbuf[4] = '\0';
    clampbuf[5] = '\0';
    clampbuf[6] = '\0';
    clampbuf[7] = '\0';
    clampbuf[8] = '\0';
    clampbuf[9] = '\0';
    clampbuf[10] = '\0';
    clampbuf[0xb] = '\0';
    clampbuf[0xc] = '\0';
    clampbuf[0xd] = '\0';
    clampbuf[0xe] = '\0';
    clampbuf[0xf] = '\0';
    uVar2 = (ctx->dest_arg).result_mod;
    local_1c8 = in_R8;
    local_1c0 = in_R9;
    if ((uVar2 & 1) == 0) {
      __s = "";
      pcVar10 = "";
    }
    else {
      ctx->metal_need_header_common = 1;
      uVar3 = (uVar3 >> 2 & 1) + (uVar3 & 1) + (uint)((uVar3 >> 1 & 1) != 0) +
              (uint)((uVar3 >> 3 & 1) != 0);
      pcVar10 = "clamp(";
      if (uVar3 == 1) {
        __s = ", 0.0, 1.0)";
      }
      else {
        __s = clampbuf;
        in_R8 = (ulong)uVar3;
        snprintf(__s,0x20,", float%d(0.0), float%d(1.0))");
        uVar2 = (ctx->dest_arg).result_mod;
      }
    }
    if ((uVar2 & 4) != 0) {
      __assert_fail("(arg->result_mod & MOD_CENTROID) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x105f,
                    "const char *make_METAL_destarg_assign(Context *, char *, const size_t, const char *, ...)"
                   );
    }
    if (ctx->predicated == 0) {
      ap[0].reg_save_area = local_1e8;
      ap[0].overflow_arg_area = &stack0x00000008;
      ap[0].gp_offset = 0x20;
      ap[0].fp_offset = 0x30;
      uVar3 = vsnprintf(operation,0x100,fmt,ap);
      if (uVar3 < 0x100) {
        uVar3 = (ctx->dest_arg).result_shift - 1;
        if (uVar3 < 0xf) {
          pcVar7 = (&PTR_anon_var_dwarf_9d0f_0013fd08)[uVar3];
        }
        else {
          pcVar7 = "";
        }
        cVar1 = *pcVar7;
        pcVar5 = get_D3D_register_string
                           (ctx,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum,regnum_str,in_R8);
        iVar4 = isscalar(ctx,ctx->shader_type,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum);
        if ((iVar4 == 0) && ((ctx->dest_arg).writemask != 0xf)) {
          writemask_str[0] = '.';
          if ((ctx->dest_arg).writemask0 == 0) {
            lVar6 = 1;
          }
          else {
            writemask_str[1] = 'x';
            lVar6 = 2;
          }
          if ((ctx->dest_arg).writemask1 != 0) {
            writemask_str[lVar6] = 'y';
            lVar6 = lVar6 + 1;
          }
          if ((ctx->dest_arg).writemask2 != 0) {
            writemask_str[lVar6] = 'z';
            lVar6 = lVar6 + 1;
          }
          if ((ctx->dest_arg).writemask3 != 0) {
            writemask_str[lVar6] = 'w';
            lVar6 = lVar6 + 1;
          }
        }
        else {
          lVar6 = 0;
        }
        pcVar8 = "(";
        if (cVar1 == '\0') {
          pcVar8 = "";
        }
        writemask_str[lVar6] = '\0';
        pcVar9 = ")";
        if (cVar1 == '\0') {
          pcVar9 = "";
        }
        snprintf(buf,buflen,"%s%s%s = %s%s%s%s%s%s;",pcVar5,regnum_str,writemask_str,pcVar10,pcVar8,
                 operation,pcVar9,pcVar7,__s);
        return buf;
      }
      pcVar10 = "operation string too large";
    }
    else {
      pcVar10 = "predicated destinations unsupported";
    }
    failf(ctx,"%s",pcVar10);
  }
  *buf = '\0';
  return buf;
}

Assistant:

static const char *make_METAL_destarg_assign(Context *ctx, char *buf,
                                            const size_t buflen,
                                            const char *fmt, ...)
{
    int need_parens = 0;
    const DestArgInfo *arg = &ctx->dest_arg;

    if (arg->writemask == 0)
    {
        *buf = '\0';
        return buf;  // no writemask? It's a no-op.
    } // if

    char clampbuf[32] = { '\0' };
    const char *clampleft = "";
    const char *clampright = "";
    if (arg->result_mod & MOD_SATURATE)
    {
        ctx->metal_need_header_common = 1;
        const int vecsize = vecsize_from_writemask(arg->writemask);
        clampleft = "clamp(";
        if (vecsize == 1)
            clampright = ", 0.0, 1.0)";
        else
        {
            snprintf(clampbuf, sizeof (clampbuf),
                     ", float%d(0.0), float%d(1.0))", vecsize, vecsize);
            clampright = clampbuf;
        } // else
    } // if

    // MSDN says MOD_PP is a hint and many implementations ignore it. So do we.

    // CENTROID only allowed in DCL opcodes, which shouldn't come through here.
    assert((arg->result_mod & MOD_CENTROID) == 0);

    if (ctx->predicated)
    {
        fail(ctx, "predicated destinations unsupported");  // !!! FIXME
        *buf = '\0';
        return buf;
    } // if

    char operation[256];
    va_list ap;
    va_start(ap, fmt);
    const int len = vsnprintf(operation, sizeof (operation), fmt, ap);
    va_end(ap);
    if (len >= sizeof (operation))
    {
        fail(ctx, "operation string too large");  // I'm lazy.  :P
        *buf = '\0';
        return buf;
    } // if

    const char *result_shift_str = "";
    switch (arg->result_shift)
    {
        case 0x1: result_shift_str = " * 2.0"; break;
        case 0x2: result_shift_str = " * 4.0"; break;
        case 0x3: result_shift_str = " * 8.0"; break;
        case 0xD: result_shift_str = " / 8.0"; break;
        case 0xE: result_shift_str = " / 4.0"; break;
        case 0xF: result_shift_str = " / 2.0"; break;
    } // switch
    need_parens |= (result_shift_str[0] != '\0');

    char regnum_str[16];
    const char *regtype_str = get_METAL_register_string(ctx, arg->regtype,
                                                       arg->regnum, regnum_str,
                                                       sizeof (regnum_str));
    char writemask_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !writemask_xyzw(arg->writemask))
    {
        writemask_str[i++] = '.';
        if (arg->writemask0) writemask_str[i++] = 'x';
        if (arg->writemask1) writemask_str[i++] = 'y';
        if (arg->writemask2) writemask_str[i++] = 'z';
        if (arg->writemask3) writemask_str[i++] = 'w';
    } // if
    writemask_str[i] = '\0';
    assert(i < sizeof (writemask_str));

    const char *leftparen = (need_parens) ? "(" : "";
    const char *rightparen = (need_parens) ? ")" : "";

    snprintf(buf, buflen, "%s%s%s = %s%s%s%s%s%s;",
             regtype_str, regnum_str, writemask_str,
             clampleft, leftparen, operation, rightparen, result_shift_str,
             clampright);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}